

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O1

void __thiscall
asio::execution::detail::any_executor_base::
execute<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>,std::error_code,unsigned_long>>
          (any_executor_base *this,
          binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>,_std::error_code,_unsigned_long>
          *f)

{
  _func_void_any_executor_base_ptr_function_view *UNRECOVERED_JUMPTABLE;
  _func_void_any_executor_base_ptr_function_ptr *p_Var1;
  non_const_lvalue<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>,_std::error_code,_unsigned_long>_>
  f2;
  function_view fVar2;
  allocator<void> local_b9;
  executor_function local_b8;
  binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>,_std::error_code,_unsigned_long>
  local_b0;
  
  UNRECOVERED_JUMPTABLE = this->target_fns_->blocking_execute;
  if (UNRECOVERED_JUMPTABLE != (_func_void_any_executor_base_ptr_function_view *)0x0) {
    fVar2.function_ = f;
    fVar2.complete_ =
         asio::detail::executor_function_view::
         complete<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>,std::error_code,unsigned_long>>
    ;
    (*UNRECOVERED_JUMPTABLE)(this,fVar2);
    return;
  }
  p_Var1 = this->target_fns_->execute;
  local_b0.handler_.stream_ = (f->handler_).stream_;
  local_b0.handler_.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
  super_const_buffer.data_ =
       (f->handler_).buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
       super_const_buffer.data_;
  local_b0.handler_.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
  super_const_buffer.size_ =
       (f->handler_).buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
       super_const_buffer.size_;
  local_b0.handler_.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.total_consumed_ =
       (f->handler_).buffers_.super_consuming_single_buffer<asio::const_buffers_1>.total_consumed_;
  local_b0.handler_.start_ = (f->handler_).start_;
  local_b0.handler_.handler_.next_layer_ = (f->handler_).handler_.next_layer_;
  local_b0.handler_.handler_.core_ = (f->handler_).handler_.core_;
  local_b0.handler_.handler_.op_.type_ = (f->handler_).handler_.op_.type_;
  local_b0.handler_.handler_.start_ = (f->handler_).handler_.start_;
  local_b0.handler_.handler_.want_ = (f->handler_).handler_.want_;
  local_b0.handler_.handler_.ec_._M_value = (f->handler_).handler_.ec_._M_value;
  local_b0.handler_.handler_.ec_._4_4_ = *(undefined4 *)&(f->handler_).handler_.ec_.field_0x4;
  local_b0.handler_.handler_.ec_._M_cat = (f->handler_).handler_.ec_._M_cat;
  local_b0.handler_.handler_.handler_._8_8_ =
       *(undefined8 *)&(f->handler_).handler_.handler_.field_0x8;
  local_b0.handler_.handler_.bytes_transferred_ = (f->handler_).handler_.bytes_transferred_;
  local_b0.handler_.handler_.handler_._M_f = (f->handler_).handler_.handler_._M_f;
  local_b0.handler_.handler_.handler_._M_bound_args.
  super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
  .super__Tuple_impl<1UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>.
  super__Head_base<1UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
  super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (f->handler_).handler_.handler_._M_bound_args.
       super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
       .super__Tuple_impl<1UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>.
       super__Head_base<1UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
       super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b0.handler_.handler_.handler_._M_bound_args.
  super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
  .super__Tuple_impl<1UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>.
  super__Head_base<1UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
  super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (f->handler_).handler_.handler_._M_bound_args.
       super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
       .super__Tuple_impl<1UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>.
       super__Head_base<1UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
       super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (f->handler_).handler_.handler_._M_bound_args.
  super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
  .super__Tuple_impl<1UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>.
  super__Head_base<1UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
  super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (f->handler_).handler_.handler_._M_bound_args.
  super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
  .super__Tuple_impl<1UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>.
  super__Head_base<1UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
  super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_b0.handler_.handler_.handler_._M_bound_args.
  super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
  .super__Head_base<0UL,_nuraft::rpc_session_*,_false>._M_head_impl =
       (f->handler_).handler_.handler_._M_bound_args.
       super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
       .super__Head_base<0UL,_nuraft::rpc_session_*,_false>._M_head_impl;
  local_b0.arg1_._M_value = (f->arg1_)._M_value;
  local_b0.arg1_._4_4_ = *(undefined4 *)&(f->arg1_).field_0x4;
  local_b0.arg1_._M_cat = (f->arg1_)._M_cat;
  local_b0.arg2_ = f->arg2_;
  asio::detail::executor_function::
  executor_function<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>,std::error_code,unsigned_long>,std::allocator<void>>
            (&local_b8,&local_b0,&local_b9);
  (*p_Var1)(this,&local_b8);
  if (local_b8.impl_ != (impl_base *)0x0) {
    (*(local_b8.impl_)->complete_)(local_b8.impl_,false);
  }
  if (local_b0.handler_.handler_.handler_._M_bound_args.
      super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
      .super__Tuple_impl<1UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>.
      super__Head_base<1UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
      super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.handler_.handler_.handler_._M_bound_args.
               super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
               .super__Tuple_impl<1UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>.
               super__Head_base<1UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
               super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  return;
}

Assistant:

void execute(ASIO_MOVE_ARG(F) f) const
  {
    if (target_fns_->blocking_execute != 0)
    {
      asio::detail::non_const_lvalue<F> f2(f);
      target_fns_->blocking_execute(*this, function_view(f2.value));
    }
    else
    {
      target_fns_->execute(*this,
          function(ASIO_MOVE_CAST(F)(f), std::allocator<void>()));
    }
  }